

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recorder_utils.c
# Opt level: O0

Qiniu_Error
Qiniu_Utils_New_Medium
          (Qiniu_Recorder *recorder,char *recorderKey,Qiniu_Int64 version,
          Qiniu_Record_Medium *medium,Qiniu_FileInfo *fileInfo)

{
  cJSON *object;
  time_t tVar1;
  cJSON *pcVar2;
  char *__ptr;
  Qiniu_Error QVar3;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *metadataJson;
  cJSON *metadata;
  Qiniu_Error err;
  Qiniu_FileInfo *fileInfo_local;
  Qiniu_Record_Medium *medium_local;
  Qiniu_Int64 version_local;
  char *recorderKey_local;
  Qiniu_Recorder *recorder_local;
  char *local_10;
  
  QVar3.code = (*recorder->open)(recorder,recorderKey,"wb",medium);
  metadata = (cJSON *)(ulong)(uint)QVar3.code;
  if (QVar3.code == (Qiniu_Error)0xc8) {
    object = cJSON_CreateObject();
    tVar1 = time((time_t *)0x0);
    pcVar2 = cJSON_CreateNumber((double)tVar1);
    cJSON_AddItemToObject(object,"createTime",pcVar2);
    pcVar2 = cJSON_CreateNumber((double)fileInfo->st_size);
    cJSON_AddItemToObject(object,"fileSize",pcVar2);
    pcVar2 = cJSON_CreateNumber((double)(fileInfo->st_mtim).tv_sec);
    cJSON_AddItemToObject(object,"modTime",pcVar2);
    pcVar2 = cJSON_CreateNumber((double)version);
    cJSON_AddItemToObject(object,"version",pcVar2);
    __ptr = cJSON_PrintUnformatted(object);
    cJSON_Delete(object);
    QVar3.code = (*medium->writeEntry)(medium,__ptr,(size_t *)0x0);
    recorder_local = (Qiniu_Recorder *)(ulong)(uint)QVar3.code;
    free(__ptr);
    local_10 = extraout_RDX_00;
    if (QVar3.code == (Qiniu_Error)0xc8) {
      recorder_local = (Qiniu_Recorder *)Qiniu_OK._0_8_;
      local_10 = Qiniu_OK.message;
    }
  }
  else {
    recorder_local = (Qiniu_Recorder *)metadata;
    local_10 = extraout_RDX;
  }
  QVar3._0_8_ = (ulong)recorder_local & 0xffffffff;
  QVar3.message = local_10;
  return QVar3;
}

Assistant:

Qiniu_Error Qiniu_Utils_New_Medium(Qiniu_Recorder *recorder, const char *recorderKey, Qiniu_Int64 version, struct Qiniu_Record_Medium *medium, Qiniu_FileInfo *fileInfo)
{
	Qiniu_Error err = recorder->open(recorder, recorderKey, "wb", medium);
	if (err.code != 200)
	{
		return err;
	}
	cJSON *metadata = cJSON_CreateObject();
	cJSON_AddItemToObject(metadata, "createTime", cJSON_CreateNumber(time(NULL)));
	cJSON_AddItemToObject(metadata, "fileSize", cJSON_CreateNumber(fileInfo->st_size));
	cJSON_AddItemToObject(metadata, "modTime", cJSON_CreateNumber(fileInfo->st_mtime));
	cJSON_AddItemToObject(metadata, "version", cJSON_CreateNumber(version));
	char *metadataJson = cJSON_PrintUnformatted(metadata);
	cJSON_Delete(metadata);
	if (metadataJson == NULL)
	{
		err.code = 400;
		err.message = "cJSON_PrintUnformatted() error";
	}
	err = medium->writeEntry(medium, metadataJson, NULL);
	free(metadataJson);
	if (err.code != 200)
	{
		return err;
	}
	return Qiniu_OK;
}